

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::_InternalParse
          (CodeGeneratorResponse_File *this,char *ptr,ParseContext *ctx)

{
  uint uVar1;
  bool bVar2;
  string *s;
  GeneratedCodeInfo *msg;
  UnknownFieldSet *unknown;
  char cVar3;
  ulong tag_00;
  char *field_name;
  uint32_t tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    while( true ) {
      bVar2 = internal::ParseContext::Done(ctx,&local_40);
      if (bVar2) {
        return local_40;
      }
      local_40 = internal::ReadTag(local_40,&local_34,0);
      tag_00 = (ulong)local_34;
      uVar1 = local_34 >> 3;
      cVar3 = (char)local_34;
      if (uVar1 != 0x10) break;
      if (cVar3 != -0x7e) goto LAB_002bdf72;
      msg = _internal_mutable_generated_code_info(this);
      local_40 = internal::ParseContext::ParseMessage(ctx,(MessageLite *)msg,local_40);
LAB_002bdf9c:
      if (local_40 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if (uVar1 == 2) {
      if (cVar3 != '\x12') goto LAB_002bdf72;
      s = _internal_mutable_insertion_point_abi_cxx11_(this);
      local_40 = internal::InlineGreedyStringParser(s,local_40,ctx);
      field_name = "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point";
    }
    else if (uVar1 == 0xf) {
      if (cVar3 != 'z') goto LAB_002bdf72;
      s = _internal_mutable_content_abi_cxx11_(this);
      local_40 = internal::InlineGreedyStringParser(s,local_40,ctx);
      field_name = "google.protobuf.compiler.CodeGeneratorResponse.File.content";
    }
    else {
      if ((uVar1 != 1) || (cVar3 != '\n')) {
LAB_002bdf72:
        if ((tag_00 == 0) || ((local_34 & 7) == 4)) {
          if (local_40 == (char *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
          return local_40;
        }
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                            (&(this->super_Message).super_MessageLite._internal_metadata_);
        local_40 = internal::UnknownFieldParse(tag_00,unknown,local_40,ctx);
        goto LAB_002bdf9c;
      }
      s = _internal_mutable_name_abi_cxx11_(this);
      local_40 = internal::InlineGreedyStringParser(s,local_40,ctx);
      field_name = "google.protobuf.compiler.CodeGeneratorResponse.File.name";
    }
    internal::VerifyUTF8(s,field_name);
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* CodeGeneratorResponse_File::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.File.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional string insertion_point = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          auto str = _internal_mutable_insertion_point();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional string content = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 122)) {
          auto str = _internal_mutable_content();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.File.content");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional .google.protobuf.GeneratedCodeInfo generated_code_info = 16;
      case 16:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 130)) {
          ptr = ctx->ParseMessage(_internal_mutable_generated_code_info(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}